

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_if_connect_tcp(mg_connection *nc,socket_address *sa)

{
  int iVar1;
  int *piVar2;
  int local_24;
  int local_20;
  int rc;
  socket_address *sa_local;
  mg_connection *nc_local;
  
  iVar1 = socket(2,1,0);
  nc->sock = iVar1;
  if (nc->sock < 0) {
    nc->sock = -1;
    piVar2 = __errno_location();
    if (*piVar2 == 0) {
      local_20 = 1;
    }
    else {
      piVar2 = __errno_location();
      local_20 = *piVar2;
    }
    nc->err = local_20;
  }
  else {
    mg_set_non_blocking_mode(nc->sock);
    iVar1 = connect(nc->sock,(sockaddr *)&sa->sa,0x10);
    iVar1 = mg_is_error(iVar1);
    if (iVar1 == 0) {
      local_24 = 0;
    }
    else {
      piVar2 = __errno_location();
      local_24 = *piVar2;
    }
    nc->err = local_24;
    if (LL_DEBUG < s_cs_log_level) {
      fprintf(_stderr,"%-20s ","mg_if_connect_tcp");
      cs_log_printf("%p sock %d err %d",nc,(ulong)(uint)nc->sock,(ulong)(uint)nc->err);
    }
  }
  return;
}

Assistant:

void mg_if_connect_tcp(struct mg_connection *nc,
                       const union socket_address *sa) {
    int rc;
    nc->sock = socket(AF_INET, SOCK_STREAM, 0);
    if (nc->sock < 0) {
        nc->sock = INVALID_SOCKET;
        nc->err = errno ? errno : 1;
        return;
    }
#if !defined(MG_CC3200) && !defined(MG_ESP8266)
    mg_set_non_blocking_mode(nc->sock);
#endif
    rc = connect(nc->sock, &sa->sa, sizeof(sa->sin));
    nc->err = mg_is_error(rc) ? errno : 0;
    DBG(("%p sock %d err %d", nc, nc->sock, nc->err));
}